

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_transfers_db(feed_db_t *db,transfer_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_118 [8];
  char qr [84];
  sqlite3_stmt *stmt;
  int i;
  int record_count;
  feed_db_status_t res;
  transfer_t record;
  transfer_t **records_local;
  feed_db_t *db_local;
  
  record._128_8_ = records;
  db_local._4_4_ = count_rows_db(db,"transfers");
  stmt._4_4_ = 0;
  if (0 < db_local._4_4_) {
    memcpy(local_118,
           "SELECT from_stop_id, to_stop_id, transfer_type, min_transfer_time FROM `transfers`;",
           0x54);
    sqlite3_prepare_v2(db->conn,local_118,-1,(sqlite3_stmt **)(qr + 0x50),(char **)0x0);
    pvVar2 = malloc((long)db_local._4_4_ * 0x88);
    *(void **)record._128_8_ = pvVar2;
    if (*(long *)record._128_8_ == 0) {
      sqlite3_finalize(stack0xffffffffffffff40);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(stack0xffffffffffffff40);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_transfer((transfer_t *)&record_count);
        puVar3 = sqlite3_column_text(stack0xffffffffffffff40,0);
        strcpy((char *)&record_count,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xffffffffffffff40,1);
        strcpy(record.from_stop_id + 0x38,(char *)puVar3);
        record.to_stop_id._56_4_ = sqlite3_column_int(stack0xffffffffffffff40,2);
        record.to_stop_id._60_4_ = sqlite3_column_int(stack0xffffffffffffff40,3);
        memcpy((void *)(*(long *)record._128_8_ + (long)stmt._4_4_ * 0x88),&record_count,0x88);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < db_local._4_4_);
      sqlite3_finalize(stack0xffffffffffffff40);
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_transfers_db(feed_db_t *db, transfer_t **records) {

    transfer_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "transfers");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "from_stop_id, to_stop_id, transfer_type, min_transfer_time "
                "FROM `transfers`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_transfer(&record);

        strcpy(record.from_stop_id, sqlite3_column_text(stmt, 0));
        strcpy(record.to_stop_id, sqlite3_column_text(stmt, 1));
        record.transfer_type = (transfer_type_t)sqlite3_column_int(stmt, 2);
        record.min_transfer_time = sqlite3_column_int(stmt, 3);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}